

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O0

_Bool dns_get_inet_qtype(char *buf,size_t len,uint16_t *qtype)

{
  uint16_t uVar1;
  uint16_t uVar2;
  char *pcVar3;
  char *p;
  dns_header_t *hdr;
  uint16_t *qtype_local;
  size_t len_local;
  char *buf_local;
  
  if ((0xc < len) && (uVar1 = ntohs(*(uint16_t *)(buf + 4)), uVar1 != 0)) {
    pcVar3 = _dns_skip_qname(buf + 0xc);
    uVar1 = *(uint16_t *)(pcVar3 + 2);
    uVar2 = htons(1);
    if (uVar1 == uVar2) {
      uVar1 = ntohs(*(uint16_t *)(pcVar3 + 2));
      *qtype = uVar1;
      return true;
    }
    return false;
  }
  return false;
}

Assistant:

bool dns_get_inet_qtype(const char * buf, size_t len, uint16_t * qtype)
{
    struct dns_header_t * hdr = (struct dns_header_t *)buf;
    const char * p = (const char *)hdr;

    if (len <= sizeof(*hdr) || ntohs(hdr->qdcount) == 0)
        return false;
    
    // skip header
    p += sizeof(*hdr);
    // skip QNAME
    p = _dns_skip_qname(p);
    // skip QTYPE
    if (*(uint16_t *)(p += sizeof(uint16_t)) == htons(CLASS_IN)) {
        * qtype = ntohs(*(uint16_t *)p);
        return true;
    }
    return false;
}